

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O1

FunctionBody * TTD::JsSupport::ForceAndGetFunctionBody(ParseableFunctionInfo *pfi)

{
  FunctionInfo *pFVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DeferDeserializeFunctionInfo *this;
  ParseableFunctionInfo *this_00;
  
  if ((pfi->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x530,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_0093ad6f;
    *puVar4 = 0;
  }
  if ((ParseableFunctionInfo *)(((pfi->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr
      != pfi) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x531,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                       "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) goto LAB_0093ad6f;
    *puVar4 = 0;
  }
  pFVar1 = (pfi->super_FunctionProxy).functionInfo.ptr;
  if ((pFVar1->attributes & DeferredDeserialize) == None) {
    if (pFVar1 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x53e,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) goto LAB_0093ad6f;
      *puVar4 = 0;
    }
    if ((ParseableFunctionInfo *)
        (((pfi->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != pfi) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x53f,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                         "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar3) goto LAB_0093ad6f;
      *puVar4 = 0;
    }
    if ((((pfi->super_FunctionProxy).functionInfo.ptr)->attributes & DeferredParse) == None) {
      bVar3 = Js::FunctionProxy::IsFunctionBody(&pfi->super_FunctionProxy);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
        if (!bVar3) {
LAB_0093ad6f:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
    }
    else {
      this_00 = Js::FunctionProxy::GetParseableFunctionInfo(&pfi->super_FunctionProxy);
      pfi = &Js::ParseableFunctionInfo::Parse(this_00,(ScriptFunction **)0x0,false)->
             super_ParseableFunctionInfo;
    }
  }
  else {
    this = Js::FunctionProxy::GetDeferDeserializeFunctionInfo(&pfi->super_FunctionProxy);
    pfi = &Js::DeferDeserializeFunctionInfo::Deserialize(this)->super_ParseableFunctionInfo;
  }
  if ((FunctionBody *)pfi == (FunctionBody *)0x0) {
    TTDAbort_unrecoverable_error("I just want a function body!!!");
  }
  Js::FunctionProxy::EnsureDeserialized(&pfi->super_FunctionProxy);
  return (FunctionBody *)pfi;
}

Assistant:

Js::FunctionBody* ForceAndGetFunctionBody(Js::ParseableFunctionInfo* pfi)
        {
            Js::FunctionBody* fb = nullptr;

            if(pfi->IsDeferredDeserializeFunction())
            {
                Js::DeferDeserializeFunctionInfo* deferDeserializeInfo = pfi->GetDeferDeserializeFunctionInfo();
                fb = deferDeserializeInfo->Deserialize();
            }
            else
            {
                if(pfi->IsDeferredParseFunction())
                {
                    fb = pfi->GetParseableFunctionInfo()->Parse();
                }
                else
                {
                    fb = pfi->GetFunctionBody();
                }
            }
            TTDAssert(fb != nullptr, "I just want a function body!!!");

            fb->EnsureDeserialized();
            return fb;
        }